

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

int libtorrent::merkle_num_layers(int leaves)

{
  int layers;
  
  layers = 0;
  for (; 1 < leaves; leaves = (uint)leaves >> 1) {
    layers = layers + 1;
  }
  return layers;
}

Assistant:

int merkle_num_layers(int leaves)
	{
		// leaves must be a power of 2
		TORRENT_ASSERT((leaves & (leaves - 1)) == 0);
		int layers = 0;
		while (leaves > 1)
		{
			++layers;
			leaves >>= 1;
		}
		return layers;
	}